

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O0

void __thiscall
vkt::SpirVAssembly::InstanceContext::InstanceContext(InstanceContext *this,InstanceContext *other)

{
  RGBA *local_50;
  RGBA *local_30;
  InstanceContext *other_local;
  InstanceContext *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::map(&this->moduleMap,&other->moduleMap);
  local_30 = this->inputColors;
  do {
    tcu::RGBA::RGBA(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != this->outputColors);
  local_50 = this->outputColors;
  do {
    tcu::RGBA::RGBA(local_50);
    local_50 = local_50 + 1;
  } while ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50 != &this->testCodeFragments);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->testCodeFragments,&other->testCodeFragments);
  std::
  map<vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map(&this->specConstants,&other->specConstants);
  this->hasTessellation = (bool)(other->hasTessellation & 1);
  this->requiredStages = other->requiredStages;
  this->failResult = other->failResult;
  std::__cxx11::string::string
            ((string *)&this->failMessageTemplate,(string *)&other->failMessageTemplate);
  this->inputColors[0].m_value = other->inputColors[0].m_value;
  this->inputColors[1].m_value = other->inputColors[1].m_value;
  this->inputColors[2].m_value = other->inputColors[2].m_value;
  this->inputColors[3].m_value = other->inputColors[3].m_value;
  this->outputColors[0].m_value = other->outputColors[0].m_value;
  this->outputColors[1].m_value = other->outputColors[1].m_value;
  this->outputColors[2].m_value = other->outputColors[2].m_value;
  this->outputColors[3].m_value = other->outputColors[3].m_value;
  return;
}

Assistant:

InstanceContext::InstanceContext (const InstanceContext& other)
	: moduleMap				(other.moduleMap)
	, testCodeFragments		(other.testCodeFragments)
	, specConstants			(other.specConstants)
	, hasTessellation		(other.hasTessellation)
	, requiredStages		(other.requiredStages)
	, failResult			(other.failResult)
	, failMessageTemplate	(other.failMessageTemplate)
{
	inputColors[0]		= other.inputColors[0];
	inputColors[1]		= other.inputColors[1];
	inputColors[2]		= other.inputColors[2];
	inputColors[3]		= other.inputColors[3];

	outputColors[0]		= other.outputColors[0];
	outputColors[1]		= other.outputColors[1];
	outputColors[2]		= other.outputColors[2];
	outputColors[3]		= other.outputColors[3];
}